

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool cmState::IsCacheEntryType(string *key)

{
  int iVar1;
  char **ppcVar2;
  bool bVar3;
  
  if (cmCacheEntryTypes[0] == (char *)0x0) {
    return false;
  }
  ppcVar2 = cmCacheEntryTypes;
  do {
    ppcVar2 = ppcVar2 + 1;
    iVar1 = std::__cxx11::string::compare((char *)key);
    bVar3 = iVar1 == 0;
    if (bVar3) {
      return bVar3;
    }
  } while (*ppcVar2 != (char *)0x0);
  return bVar3;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  for (int i = 0; cmCacheEntryTypes[i]; ++i) {
    if (key == cmCacheEntryTypes[i]) {
      return true;
    }
  }
  return false;
}